

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

Matrix * Transp_M(Matrix *M)

{
  LASErrIdType LVar1;
  Matrix *M_00;
  char *pcVar2;
  size_t sVar3;
  char *Object1Name;
  ElOrderType EVar4;
  
  M_Lock(M);
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    M_00 = (Matrix *)0x0;
    goto LAB_0010d356;
  }
  M_00 = (Matrix *)malloc(0x50);
  pcVar2 = M_GetName(M);
  sVar3 = strlen(pcVar2);
  pcVar2 = (char *)malloc(sVar3 + 10);
  Object1Name = M_GetName(M);
  if (pcVar2 == (char *)0x0 || M_00 == (Matrix *)0x0) {
    LASError(LASMemAllocErr,"Transp_M",Object1Name,(char *)0x0,(char *)0x0);
    if (M_00 != (Matrix *)0x0) {
      free(M_00);
    }
  }
  else {
    sprintf(pcVar2,"(%s)^T",Object1Name);
    EVar4 = Clmws;
    M_Constr(M_00,pcVar2,M->ClmDim,M->RowDim,M->ElOrder,Tempor,False);
    LVar1 = LASResult();
    if (LVar1 == LASOK) {
      if (M->ElOrder == Rowws) {
LAB_0010d2df:
        M_00->ElOrder = EVar4;
      }
      else if (M->ElOrder == Clmws) {
        EVar4 = Rowws;
        goto LAB_0010d2df;
      }
      M_00->Multipl = M->Multipl;
      if ((M->Instance == Tempor) && (M->OwnData != False)) {
        M->OwnData = False;
        M_00->OwnData = True;
      }
      M_00->Len = M->Len;
      M_00->El = M->El;
      M_00->ElSorted = M->ElSorted;
    }
  }
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
LAB_0010d356:
  M_Unlock(M);
  return M_00;
}

Assistant:

Matrix *Transp_M(Matrix *M)
/* MRes = M^T, returns transposed matrix M */
{
    Matrix *MRes;

    char *MResName;

    M_Lock(M);
    
    if (LASResult() == LASOK) {
        MRes = (Matrix *)malloc(sizeof(Matrix));
        MResName = (char *)malloc((strlen(M_GetName(M)) + 10) * sizeof(char));
        if (MRes != NULL && MResName != NULL) {
            sprintf(MResName, "(%s)^T", M_GetName(M));
            M_Constr(MRes, MResName,  M->ClmDim, M->RowDim, M->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                if (M->ElOrder == Rowws)
                    MRes->ElOrder = Clmws;
                if (M->ElOrder == Clmws)
                    MRes->ElOrder = Rowws;
                MRes->Multipl = M->Multipl;
                if (M->Instance == Tempor && M->OwnData) {
                    M->OwnData = False;
                    MRes->OwnData = True;
                }
                MRes->Len = M->Len;
                MRes->El = M->El;
                MRes->ElSorted = M->ElSorted;
            }
        } else {
            LASError(LASMemAllocErr, "Transp_M", M_GetName(M), NULL, NULL);
            if (MRes != NULL)
                free(MRes);
        }
            
        if (MResName != NULL)
            free(MResName);
    } else {
        MRes = NULL;
    }

    M_Unlock(M);

    return(MRes);
}